

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O2

int CfdVerifyPsbtTxIn(void *handle,void *psbt_handle,char *txid,uint32_t vout)

{
  Psbt *this;
  bool bVar1;
  CfdException *pCVar2;
  allocator local_71;
  OutPoint local_70;
  Txid txid_obj;
  
  cfd::Initialize();
  std::__cxx11::string::string((string *)&local_70,"PsbtHandle",(allocator *)&txid_obj);
  cfd::capi::CheckBuffer(psbt_handle,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  bVar1 = cfd::capi::IsEmptyString(txid);
  if (bVar1) {
    local_70.txid_._vptr_Txid = (_func_int **)0x4fd756;
    local_70.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x95e;
    local_70.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = "CfdVerifyPsbtTxIn";
    cfd::core::logger::warn<>((CfdSourceLocation *)&local_70,"txid is null or empty.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&local_70,"Failed to parameter. txid is null or empty.",
               (allocator *)&txid_obj);
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&local_70);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(long *)((long)psbt_handle + 0x18) != 0) {
    std::__cxx11::string::string((string *)&local_70,txid,&local_71);
    cfd::core::Txid::Txid(&txid_obj,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    this = *(Psbt **)((long)psbt_handle + 0x18);
    cfd::core::OutPoint::OutPoint(&local_70,&txid_obj,vout);
    cfd::Psbt::Verify(this,&local_70);
    cfd::core::Txid::~Txid(&local_70.txid_);
    cfd::core::Txid::~Txid(&txid_obj);
    return 0;
  }
  local_70.txid_._vptr_Txid = (_func_int **)0x4fd756;
  local_70.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x964;
  local_70.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = "CfdVerifyPsbtTxIn";
  cfd::core::logger::warn<>((CfdSourceLocation *)&local_70,"psbt is null.");
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&local_70,"Failed to handle statement. psbt is null.",(allocator *)&txid_obj)
  ;
  cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalStateError,(string *)&local_70);
  __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdVerifyPsbtTxIn(
    void* handle, void* psbt_handle, const char* txid, uint32_t vout) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }

    Txid txid_obj(txid);
    psbt_obj->psbt->Verify(OutPoint(txid_obj, vout));
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
    if (std::string(except.what()) == "psbt txin not finalized yet.") {
      result = kCfdSignVerificationError;
    }
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}